

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPBase.cpp
# Opt level: O1

string * __thiscall
adios2::format::BPBase::ReadBPString_abi_cxx11_
          (string *__return_storage_ptr__,BPBase *this,vector<char,_std::allocator<char>_> *buffer,
          size_t *position,bool isLittleEndian)

{
  size_t sVar1;
  pointer pcVar2;
  ulong uVar3;
  
  pcVar2 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  uVar3 = (ulong)*(ushort *)(pcVar2 + *position);
  sVar1 = *position + 2;
  *position = sVar1;
  if (uVar3 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    pcVar2 = pcVar2 + sVar1;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + uVar3);
    *position = *position + uVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BPBase::ReadBPString(const std::vector<char> &buffer, size_t &position,
                                 const bool isLittleEndian) const noexcept
{
    const size_t size =
        static_cast<size_t>(helper::ReadValue<uint16_t>(buffer, position, isLittleEndian));

    if (size == 0)
    {
        return "";
    }

    const std::string values(&buffer[position], size);
    position += size;
    return values;
}